

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

int CVmObjBigNum::is_frac_zero(char *ext)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar2 = 0;
  if (0 < (short)*(ushort *)(ext + 2)) {
    uVar2 = *(ushort *)(ext + 2);
  }
  uVar4 = (ulong)uVar2;
  iVar5 = (uint)uVar2 << 2;
  do {
    if (*(ushort *)ext <= uVar4) {
      return 1;
    }
    uVar3 = uVar4 >> 1;
    bVar1 = (byte)iVar5;
    uVar4 = uVar4 + 1;
    iVar5 = iVar5 + 4;
  } while (((byte)ext[uVar3 + 5] >> (~bVar1 & 4) & 0xf) == 0);
  return 0;
}

Assistant:

int CVmObjBigNum::is_frac_zero(const char *ext)
{
    size_t idx;
    int exp = get_exp(ext);
    size_t prec = get_prec(ext);

    /* start at the first fractional digit, if represented */
    idx = (exp <= 0 ? 0 : (size_t)exp);

    /* scan the digits for a non-zero digit */
    for ( ; idx < prec ; ++idx)
    {
        /* if this digit is non-zero, the fraction is non-zero */
        if (get_dig(ext, idx) != 0)
            return FALSE;
    }

    /* we didn't find any non-zero fractional digits */
    return TRUE;
}